

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O3

bool __thiscall
slang::CommandLine::parse
          (CommandLine *this,
          span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
          args,ParseOptions options)

{
  char *__s;
  bool bVar1;
  char cVar2;
  span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL> sVar3;
  CommandLine *this_00;
  ParseOptions options_00;
  uint uVar4;
  _List *p_Var5;
  void *pvVar6;
  long lVar7;
  _Base_ptr p_Var8;
  iterator iVar9;
  iterator iVar10;
  Option *pOVar11;
  runtime_error *this_01;
  size_type sVar12;
  size_type extraout_RDX_00;
  size_type extraout_RDX_01;
  size_type extraout_RDX_02;
  size_type extraout_RDX_03;
  size_type extraout_RDX_04;
  size_type extraout_RDX_05;
  size_type extraout_RDX_06;
  size_type extraout_RDX_07;
  size_type extraout_RDX_08;
  size_type extraout_RDX_10;
  size_type extraout_RDX_11;
  size_type extraout_RDX_12;
  size_type sVar13;
  size_type extraout_RDX_13;
  _Rb_tree_color _Var14;
  bool bVar15;
  undefined8 uVar16;
  _Alloc_hider _Var17;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  in_R9;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  aVar18;
  size_type __rlen;
  _Base_ptr p_Var19;
  path *this_02;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  aVar20;
  pointer pbVar21;
  string_view *psVar22;
  string_view name;
  string_view fmt;
  string_view name_00;
  string_view fmt_00;
  string_view fmt_01;
  string_view arg;
  string_view fmt_02;
  string_view fmt_03;
  string_view fmt_04;
  string_view arg_00;
  string_view arg_01;
  format_args args_00;
  string_view value_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  format_args args_05;
  bool hadUnknowns;
  string result;
  string nearest;
  string_view value;
  bool local_161;
  CommandLine *local_160;
  ParseOptions local_154;
  path local_150;
  path local_128;
  string local_100;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_e0;
  _Base_ptr local_d8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  local_d0;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  local_c8;
  _Base_ptr local_c0;
  string_view local_b8;
  string_view local_a8;
  _Base_ptr local_98;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_90;
  _Base_ptr local_88;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  size_type local_70;
  span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL> local_60
  ;
  string local_50;
  size_type extraout_RDX;
  size_type extraout_RDX_09;
  
  local_160 = this;
  local_60 = args;
  if ((this->optionMap)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"No options defined");
LAB_001b641c:
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (((uint)options >> 8 & 1) != 0) goto LAB_001b5c51;
  if (args.size_ == 0) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"Expected at least one argument");
    goto LAB_001b641c;
  }
  this_02 = &local_150;
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            (this_02,args.data_,auto_format);
  if ((_Base_ptr)local_150._M_pathname._M_string_length == (_Base_ptr)0x0) {
LAB_001b5bb6:
    std::filesystem::__cxx11::path::path(&local_128);
  }
  else {
    uVar4 = (uint)local_150._M_cmpts._M_impl._M_t.
                  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                  _M_head_impl;
    if ((~(byte)local_150._M_cmpts._M_impl._M_t.
                super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                ._M_t.
                super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                _M_head_impl & 3) != 0) {
      if ((((ulong)local_150._M_cmpts._M_impl._M_t.
                   super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                   .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                   _M_head_impl & 3) == 0) &&
         ((local_150._M_pathname._M_dataplus._M_p + -1)[local_150._M_pathname._M_string_length] !=
          '/')) {
        if (((ulong)local_150._M_cmpts._M_impl._M_t.
                    super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                    .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                    _M_head_impl & 3) == 0) {
          lVar7 = std::filesystem::__cxx11::path::_List::end();
          this_02 = (path *)(lVar7 + -0x30);
          p_Var5 = (_List *)(lVar7 + -0x10);
          if (((ulong)local_150._M_cmpts._M_impl._M_t.
                      super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                      .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                      _M_head_impl & 3) != 0) {
            p_Var5 = &local_150._M_cmpts;
            this_02 = &local_150;
          }
          uVar4 = (uint)(_Impl *)(p_Var5->_M_impl)._M_t.
                                 super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                                 .
                                 super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
          ;
        }
        else {
          this_02 = &local_150;
        }
        if ((~uVar4 & 3) == 0) goto LAB_001b5ba7;
      }
      goto LAB_001b5bb6;
    }
LAB_001b5ba7:
    std::filesystem::__cxx11::path::path(&local_128,this_02);
  }
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_100,local_128._M_pathname._M_dataplus._M_p,
             local_128._M_pathname._M_dataplus._M_p + local_128._M_pathname._M_string_length);
  std::__cxx11::string::operator=((string *)&local_160->programName,(string *)&local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,(ulong)(local_100.field_2._M_allocated_capacity + 1))
    ;
  }
  std::filesystem::__cxx11::path::~path(&local_128);
  std::filesystem::__cxx11::path::~path(&local_150);
  local_60 = nonstd::span_lite::
             span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
             ::subspan(&local_60,1,0xffffffffffffffff);
LAB_001b5c51:
  sVar12 = local_60.size_;
  pbVar21 = local_60.data_;
  local_161 = false;
  if (sVar12 != 0) {
    local_e0 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &local_160->errors;
    local_80 = &local_160->cmdIgnore;
    local_88 = &(local_160->cmdIgnore)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_90 = &local_160->cmdRename;
    local_98 = &(local_160->cmdRename)._M_t._M_impl.super__Rb_tree_header._M_header;
    pOVar11 = (Option *)0x0;
    bVar15 = false;
    _Var14 = _S_red;
    local_c0 = (_Base_ptr)0x0;
    local_c8.values_ = (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)0x0;
    local_d8 = (_Base_ptr)0x0;
    local_d0.values_ = (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)0x0;
    sVar3 = local_60;
    local_154 = options;
    do {
      sVar13 = sVar3.size_;
      psVar22 = sVar3.data_;
      if (_Var14 == _S_red) {
        p_Var19 = (_Base_ptr)psVar22->_M_len;
        aVar18 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
                  )psVar22->_M_str;
        if (pOVar11 == (Option *)0x0) {
          if ((p_Var19 < (_Base_ptr)0x2 || bVar15) ||
             ((bVar1 = ((aVar18.values_)->field_0).bool_value, bVar1 != true && (bVar1 != true)))) {
            if (local_d8 == (_Base_ptr)0x0) {
              local_d8 = p_Var19;
              local_d0 = aVar18;
            }
            pOVar11 = (local_160->positional).
                      super___shared_ptr<slang::CommandLine::Option,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr;
            if (pOVar11 == (Option *)0x0) goto LAB_001b5f40;
            _Var14 = _S_red;
            Option::set_abi_cxx11_
                      (&local_50,pOVar11,(string_view)(ZEXT816(0x3f0621) << 0x40),*psVar22,
                       (bool)(local_154.ignoreDuplicates & 1));
            sVar13 = extraout_RDX_04;
            uVar16 = local_50.field_2._M_allocated_capacity;
            _Var17._M_p = local_50._M_dataplus._M_p;
            in_R9 = aVar18;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) goto LAB_001b5f38;
          }
          else {
            if ((p_Var19 == (_Base_ptr)0x2) && (*(short *)&(aVar18.values_)->field_0 == 0x2d2d)) {
              bVar15 = true;
              goto LAB_001b5f40;
            }
            if ((local_160->cmdIgnore)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
LAB_001b5f56:
              if ((local_160->cmdRename)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
                local_128._M_pathname._M_dataplus._M_p = (pointer)&local_128._M_pathname.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_128,aVar18.values_,
                           (char *)((long)&p_Var19->_M_color + (long)&(aVar18.values_)->field_0));
                iVar10 = std::
                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::find(&local_90->_M_t,&local_128._M_pathname);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_128._M_pathname._M_dataplus._M_p != &local_128._M_pathname.field_2) {
                  operator_delete(local_128._M_pathname._M_dataplus._M_p,
                                  (ulong)(local_128._M_pathname.field_2._M_allocated_capacity + 1));
                }
                if (iVar10._M_node != local_98) {
                  aVar18 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
                            )((anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
                               *)(iVar10._M_node + 2))->values_;
                  p_Var19 = iVar10._M_node[2]._M_parent;
                }
              }
              options_00 = local_154;
              if (((aVar18.values_)->field_0).bool_value != true) {
                if (p_Var19 == (_Base_ptr)0x0) {
LAB_001b6432:
                  std::__throw_out_of_range_fmt
                            ("%s: __pos (which is %zu) > __size (which is %zu)",
                             "basic_string_view::substr",1,0);
                }
                local_b8._M_len = (long)&p_Var19[-1]._M_right + 7;
                local_b8._M_str = (char *)((long)&(aVar18.values_)->field_0 + 1);
                cVar2 = *(char *)((long)&(aVar18.values_)->field_0 + 1);
                if (cVar2 == '-') {
                  if ((_Base_ptr)local_b8._M_len == (_Base_ptr)0x0) goto LAB_001b6432;
                  local_b8._M_len = (long)&p_Var19[-1]._M_right + 6;
                  local_b8._M_str = (char *)((long)&(aVar18.values_)->field_0 + 2);
                }
                local_a8._M_len = 0;
                local_a8._M_str = (char *)0x0;
                arg_01._M_str = local_b8._M_str;
                arg_01._M_len = local_b8._M_len;
                pOVar11 = findOption(local_160,arg_01,&local_a8);
                if ((cVar2 == '-') || (pOVar11 != (Option *)0x0)) {
                  sVar13 = extraout_RDX_07;
                  p_Var8 = p_Var19;
                  aVar20 = aVar18;
                  if (pOVar11 != (Option *)0x0) goto LAB_001b60b0;
LAB_001b6166:
                  this_00 = local_160;
                  local_128._M_pathname._M_dataplus._M_p = (local_160->programName)._M_dataplus._M_p
                  ;
                  local_128._M_pathname._M_string_length = (local_160->programName)._M_string_length
                  ;
                  fmt_01.size_ = 0xdd;
                  fmt_01.data_ = (char *)0x26;
                  args_02.field_1.values_ = in_R9.values_;
                  args_02.desc_ = (unsigned_long_long)&local_128;
                  local_128._M_pathname.field_2._M_allocated_capacity = (size_type)aVar18;
                  local_128._M_pathname.field_2._8_8_ = p_Var19;
                  ::fmt::v9::vformat_abi_cxx11_
                            (&local_150._M_pathname,(v9 *)"{}: unknown command line argument \'{}\'"
                             ,fmt_01,args_02);
                  arg._M_str = (char *)aVar18.values_;
                  arg._M_len = (size_t)p_Var19;
                  findNearestMatch_abi_cxx11_(&local_128._M_pathname,this_00,arg);
                  if (local_128._M_pathname._M_string_length != 0) {
                    local_78 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                *)local_128._M_pathname._M_dataplus._M_p;
                    local_70 = local_128._M_pathname._M_string_length;
                    fmt_02.size_ = 0xd;
                    fmt_02.data_ = (char *)0x14;
                    args_03.field_1.values_ = in_R9.values_;
                    args_03.desc_ = (unsigned_long_long)&local_78;
                    ::fmt::v9::vformat_abi_cxx11_
                              (&local_100,(v9 *)", did you mean \'{}\'?",fmt_02,args_03);
                    std::__cxx11::string::_M_append
                              ((char *)&local_150,(ulong)local_100._M_dataplus._M_p);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_100._M_dataplus._M_p != &local_100.field_2) {
                      operator_delete(local_100._M_dataplus._M_p,
                                      (ulong)(local_100.field_2._M_allocated_capacity + 1));
                    }
                  }
                  local_161 = true;
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<std::__cxx11::string>(local_e0,&local_150._M_pathname);
                  sVar13 = extraout_RDX_11;
                  uVar16 = local_128._M_pathname.field_2._M_allocated_capacity;
                  _Var17._M_p = local_128._M_pathname._M_dataplus._M_p;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_128._M_pathname._M_dataplus._M_p != &local_128._M_pathname.field_2) {
LAB_001b625b:
                    operator_delete(_Var17._M_p,
                                    (ulong)((long)&((
                                                  value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>
                                                  *)uVar16)->field_0 + 1));
                    sVar13 = extraout_RDX_12;
                  }
LAB_001b6263:
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_150._M_pathname._M_dataplus._M_p != &local_150._M_pathname.field_2) {
                    operator_delete(local_150._M_pathname._M_dataplus._M_p,
                                    local_150._M_pathname.field_2._M_allocated_capacity + 1);
                    sVar13 = extraout_RDX_13;
                  }
                  pOVar11 = (Option *)0x0;
                  aVar20 = local_c8;
                  p_Var8 = local_c0;
                }
                else {
                  pOVar11 = tryGroupOrPrefix(local_160,&local_b8,&local_a8,options_00);
                  sVar13 = extraout_RDX_08;
                  p_Var8 = (_Base_ptr)local_b8._M_len;
                  aVar20 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
                            )local_b8._M_str;
                  if (pOVar11 == (Option *)0x0) goto LAB_001b6166;
LAB_001b60b0:
                  if ((local_a8._M_len != 0) ||
                     (*(__index_type *)
                       ((long)&(pOVar11->storage).
                               super__Variant_base<std::optional<bool>_*,_std::optional<int>_*,_std::optional<unsigned_int>_*,_std::optional<long>_*,_std::optional<unsigned_long>_*,_std::optional<double>_*,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<int,_std::allocator<int>_>_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<long,_std::allocator<long>_>_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
                               .
                               super__Move_assign_alias<std::optional<bool>_*,_std::optional<int>_*,_std::optional<unsigned_int>_*,_std::optional<long>_*,_std::optional<unsigned_long>_*,_std::optional<double>_*,_std::optional<std::__cxx11::basic_string<char>_>_*,_std::vector<int>_*,_std::vector<unsigned_int>_*,_std::vector<long>_*,_std::vector<unsigned_long>_*,_std::vector<double>_*,_std::vector<std::__cxx11::basic_string<char>_>_*,_std::function<std::__cxx11::basic_string<char>_(std::basic_string_view<char>)>_>
                               .
                               super__Copy_assign_alias<std::optional<bool>_*,_std::optional<int>_*,_std::optional<unsigned_int>_*,_std::optional<long>_*,_std::optional<unsigned_long>_*,_std::optional<double>_*,_std::optional<std::__cxx11::basic_string<char>_>_*,_std::vector<int>_*,_std::vector<unsigned_int>_*,_std::vector<long>_*,_std::vector<unsigned_long>_*,_std::vector<double>_*,_std::vector<std::__cxx11::basic_string<char>_>_*,_std::function<std::__cxx11::basic_string<char>_(std::basic_string_view<char>)>_>
                               .
                               super__Move_ctor_alias<std::optional<bool>_*,_std::optional<int>_*,_std::optional<unsigned_int>_*,_std::optional<long>_*,_std::optional<unsigned_long>_*,_std::optional<double>_*,_std::optional<std::__cxx11::basic_string<char>_>_*,_std::vector<int>_*,_std::vector<unsigned_int>_*,_std::vector<long>_*,_std::vector<unsigned_long>_*,_std::vector<double>_*,_std::vector<std::__cxx11::basic_string<char>_>_*,_std::function<std::__cxx11::basic_string<char>_(std::basic_string_view<char>)>_>
                               .
                               super__Copy_ctor_alias<std::optional<bool>_*,_std::optional<int>_*,_std::optional<unsigned_int>_*,_std::optional<long>_*,_std::optional<unsigned_long>_*,_std::optional<double>_*,_std::optional<std::__cxx11::basic_string<char>_>_*,_std::vector<int>_*,_std::vector<unsigned_int>_*,_std::vector<long>_*,_std::vector<unsigned_long>_*,_std::vector<double>_*,_std::vector<std::__cxx11::basic_string<char>_>_*,_std::function<std::__cxx11::basic_string<char>_(std::basic_string_view<char>)>_>
                               .
                               super__Variant_storage_alias<std::optional<bool>_*,_std::optional<int>_*,_std::optional<unsigned_int>_*,_std::optional<long>_*,_std::optional<unsigned_long>_*,_std::optional<double>_*,_std::optional<std::__cxx11::basic_string<char>_>_*,_std::vector<int>_*,_std::vector<unsigned_int>_*,_std::vector<long>_*,_std::vector<unsigned_long>_*,_std::vector<double>_*,_std::vector<std::__cxx11::basic_string<char>_>_*,_std::function<std::__cxx11::basic_string<char>_(std::basic_string_view<char>)>_>
                       + 0x20) == '\0')) {
                    name_00._M_str = (char *)aVar20.values_;
                    name_00._M_len = (size_t)p_Var8;
                    value_00._M_str = local_a8._M_str;
                    value_00._M_len = local_a8._M_len;
                    in_R9 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
                             )local_a8._M_str;
                    Option::set_abi_cxx11_
                              (&local_150._M_pathname,pOVar11,name_00,value_00,
                               (bool)(options_00.ignoreDuplicates & 1));
                    sVar13 = extraout_RDX_09;
                    if ((_Base_ptr)local_150._M_pathname._M_string_length != (_Base_ptr)0x0) {
                      local_128._M_pathname._M_dataplus._M_p =
                           (local_160->programName)._M_dataplus._M_p;
                      local_128._M_pathname._M_string_length =
                           (local_160->programName)._M_string_length;
                      local_128._M_pathname.field_2._M_allocated_capacity =
                           (size_type)local_150._M_pathname._M_dataplus._M_p;
                      local_128._M_pathname.field_2._8_8_ = local_150._M_pathname._M_string_length;
                      fmt_00.size_ = 0xdd;
                      fmt_00.data_ = (char *)0x6;
                      args_01.field_1.values_ = in_R9.values_;
                      args_01.desc_ = (unsigned_long_long)&local_128;
                      ::fmt::v9::vformat_abi_cxx11_(&local_100,(v9 *)"{}: {}",fmt_00,args_01);
                      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                      emplace_back<std::__cxx11::string>(local_e0,&local_100);
                      sVar13 = extraout_RDX_10;
                      uVar16 = local_100.field_2._M_allocated_capacity;
                      _Var17._M_p = local_100._M_dataplus._M_p;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_100._M_dataplus._M_p == &local_100.field_2) goto LAB_001b6263;
                      goto LAB_001b625b;
                    }
                    goto LAB_001b6263;
                  }
                }
                local_c0 = p_Var8;
                local_c8 = aVar20;
                _Var14 = _S_red;
                bVar15 = false;
                goto LAB_001b5f44;
              }
              arg_00._M_str = (char *)aVar18.values_;
              arg_00._M_len = (size_t)p_Var19;
              handlePlusArg(local_160,arg_00,local_154,&local_161);
              _Var14 = _S_red;
              sVar13 = extraout_RDX_06;
            }
            else {
              p_Var8 = p_Var19;
              if (bVar1 == true) {
                __s = (char *)((long)&(aVar18.values_)->field_0 + 1);
                pvVar6 = memchr(__s,0x2b,(size_t)((long)&p_Var19[-1]._M_right + 7));
                lVar7 = (long)pvVar6 - (long)__s;
                if ((lVar7 != -1 && pvVar6 != (void *)0x0) &&
                   (p_Var8 = (_Base_ptr)(lVar7 + 1), p_Var19 < p_Var8)) {
                  p_Var8 = p_Var19;
                }
              }
              local_128._M_pathname._M_dataplus._M_p = (pointer)&local_128._M_pathname.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_128,aVar18.values_,
                         (char *)((long)&p_Var8->_M_color + (long)aVar18.values_));
              iVar9 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      ::find(&local_80->_M_t,&local_128._M_pathname);
              sVar13 = extraout_RDX_02;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_128._M_pathname._M_dataplus._M_p != &local_128._M_pathname.field_2) {
                operator_delete(local_128._M_pathname._M_dataplus._M_p,
                                (ulong)(local_128._M_pathname.field_2._M_allocated_capacity + 1));
                sVar13 = extraout_RDX_03;
              }
              if (iVar9._M_node == local_88) goto LAB_001b5f56;
              _Var14 = iVar9._M_node[2]._M_color;
            }
            bVar15 = false;
          }
        }
        else {
          name._M_str = (char *)local_c8.values_;
          name._M_len = (size_t)local_c0;
          Option::set_abi_cxx11_
                    (&local_150._M_pathname,pOVar11,name,*psVar22,
                     (bool)(local_154.ignoreDuplicates & 1));
          sVar13 = extraout_RDX;
          if ((_Base_ptr)local_150._M_pathname._M_string_length != (_Base_ptr)0x0) {
            local_128._M_pathname._M_dataplus._M_p = (local_160->programName)._M_dataplus._M_p;
            local_128._M_pathname._M_string_length = (local_160->programName)._M_string_length;
            local_128._M_pathname.field_2._M_allocated_capacity =
                 (size_type)local_150._M_pathname._M_dataplus._M_p;
            local_128._M_pathname.field_2._8_8_ = local_150._M_pathname._M_string_length;
            fmt.size_ = 0xdd;
            fmt.data_ = (char *)0x6;
            args_00.field_1.args_ = aVar18.args_;
            args_00.desc_ = (unsigned_long_long)&local_128;
            ::fmt::v9::vformat_abi_cxx11_(&local_100,(v9 *)"{}: {}",fmt,args_00);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>(local_e0,&local_100);
            sVar13 = extraout_RDX_00;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._M_dataplus._M_p != &local_100.field_2) {
              operator_delete(local_100._M_dataplus._M_p,
                              (ulong)(local_100.field_2._M_allocated_capacity + 1));
              sVar13 = extraout_RDX_01;
            }
          }
          uVar16 = local_150._M_pathname.field_2._M_allocated_capacity;
          _Var17._M_p = local_150._M_pathname._M_dataplus._M_p;
          in_R9 = aVar18;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_pathname._M_dataplus._M_p != &local_150._M_pathname.field_2) {
LAB_001b5f38:
            operator_delete(_Var17._M_p,uVar16 + 1);
            sVar13 = extraout_RDX_05;
            in_R9 = aVar18;
          }
LAB_001b5f40:
          _Var14 = _S_red;
        }
        pOVar11 = (Option *)0x0;
      }
      else {
        _Var14 = _Var14 - _S_black;
      }
LAB_001b5f44:
      sVar3.size_ = sVar13;
      sVar3.data_ = psVar22 + 1;
    } while (psVar22 + 1 != pbVar21 + sVar12);
    if (pOVar11 != (Option *)0x0) {
      local_128._M_pathname._M_dataplus._M_p = (local_160->programName)._M_dataplus._M_p;
      local_128._M_pathname._M_string_length = (local_160->programName)._M_string_length;
      local_128._M_pathname.field_2._M_allocated_capacity = (size_type)local_c8;
      local_128._M_pathname.field_2._8_8_ = local_c0;
      fmt_03.size_ = 0xdd;
      fmt_03.data_ = (char *)0x27;
      args_04.field_1.values_ = in_R9.values_;
      args_04.desc_ = (unsigned_long_long)&local_128;
      ::fmt::v9::vformat_abi_cxx11_
                (&local_150._M_pathname,(v9 *)"{}: no value provided for argument \'{}\'",fmt_03,
                 args_04);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>(local_e0,&local_150._M_pathname);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_pathname._M_dataplus._M_p != &local_150._M_pathname.field_2) {
        operator_delete(local_150._M_pathname._M_dataplus._M_p,
                        local_150._M_pathname.field_2._M_allocated_capacity + 1);
      }
    }
    if ((((local_160->positional).
          super___shared_ptr<slang::CommandLine::Option,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) && (local_d8 != (_Base_ptr)0x0)) && (local_161 == false)) {
      local_128._M_pathname._M_dataplus._M_p = (local_160->programName)._M_dataplus._M_p;
      local_128._M_pathname._M_string_length = (local_160->programName)._M_string_length;
      local_128._M_pathname.field_2._M_allocated_capacity = (size_type)local_d0;
      local_128._M_pathname.field_2._8_8_ = local_d8;
      fmt_04.size_ = 0xdd;
      fmt_04.data_ = (char *)0x38;
      args_05.field_1.values_ = in_R9.values_;
      args_05.desc_ = (unsigned_long_long)&local_128;
      ::fmt::v9::vformat_abi_cxx11_
                (&local_150._M_pathname,
                 (v9 *)"{}: positional arguments are not allowed (see e.g. \'{}\')",fmt_04,args_05);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>(local_e0,&local_150._M_pathname);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_pathname._M_dataplus._M_p != &local_150._M_pathname.field_2) {
        operator_delete(local_150._M_pathname._M_dataplus._M_p,
                        local_150._M_pathname.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return (local_160->errors).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start ==
         (local_160->errors).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
}

Assistant:

bool CommandLine::parse(span<const string_view> args, ParseOptions options) {
    if (optionMap.empty())
        throw std::runtime_error("No options defined");

    if (!options.ignoreProgramName) {
        if (args.empty())
            throw std::runtime_error("Expected at least one argument");

        programName = fs::path(fs::u8path(args[0])).filename().u8string();
        args = args.subspan(1);
    }

    Option* expectingVal = nullptr;
    string_view expectingValName;
    bool doubleDash = false;
    bool hadUnknowns = false;
    string_view firstPositional;

    int skip = 0;
    for (auto arg : args) {
        // Skip N arguments if needed (set by the cmdIgnore feature)
        if (skip) {
            skip--;
            continue;
        }

        // If we were previously expecting a value, set that now.
        if (expectingVal) {
            std::string result = expectingVal->set(expectingValName, arg, options.ignoreDuplicates);
            if (!result.empty())
                errors.emplace_back(fmt::format("{}: {}", programName, result));

            expectingVal = nullptr;
            continue;
        }

        // This is a positional argument if:
        // - Doesn't start with '-' and '+'
        // - Is exactly '-'
        // - Or we've seen a double dash already
        if (arg.length() <= 1 || doubleDash || (arg[0] != '-' && arg[0] != '+')) {
            if (firstPositional.empty())
                firstPositional = arg;

            if (positional)
                positional->set(""sv, arg, options.ignoreDuplicates);

            continue;
        }

        // Double dash indicates that all further arguments are positional.
        if (arg == "--"sv) {
            doubleDash = true;
            continue;
        }

        // Check if arg is in the list of commands to skip.
        if (!cmdIgnore.empty()) {
            // If we ignore a vendor command of the form +xx ,
            // we match on any +xx+yyy command as +yy is the command's argument.
            string_view ignoreArg = arg;
            if (arg[0] == '+') {
                size_t plusIndex = arg.substr(1).find_first_of('+');
                if (plusIndex != string_view::npos) {
                    ignoreArg = arg.substr(0, plusIndex +
                                                  1); // +1 because we started from arg.substr(1)
                }
            }

            if (auto it = cmdIgnore.find(std::string(ignoreArg)); it != cmdIgnore.end()) {
                // if yes, find how many args to skip
                skip = it->second;
                continue;
            }
        }

        // Check if arg is in the list of commands to translate.
        if (!cmdRename.empty()) {
            if (auto it = cmdRename.find(std::string(arg)); it != cmdRename.end()) {
                // if yes, rename argument
                arg = it->second;
            }
        }

        // Handle plus args, which are treated differently from all others.
        if (arg[0] == '+') {
            handlePlusArg(arg, options, hadUnknowns);
            continue;
        }

        // Get the raw name without leading dashes.
        bool longName = false;
        string_view name = arg.substr(1);
        if (name[0] == '-') {
            longName = true;
            name = name.substr(1);
        }

        string_view value;
        auto option = findOption(name, value);

        // If we didn't find the option and there was only a single dash,
        // maybe this was actually a group of single-char options or a prefixed value.
        if (!option && !longName) {
            option = tryGroupOrPrefix(name, value, options);
            if (option)
                arg = name;
        }

        // If we still didn't find it, that's an error.
        if (!option) {
            // Try to find something close to give a better error message.
            auto error = fmt::format("{}: unknown command line argument '{}'"sv, programName, arg);
            auto nearest = findNearestMatch(arg);
            if (!nearest.empty())
                error += fmt::format(", did you mean '{}'?"sv, nearest);

            hadUnknowns = true;
            errors.emplace_back(std::move(error));
            continue;
        }

        // Otherwise, we found what we wanted. If we have a value already, go ahead
        // and set it. Otherwise if we're expecting a value, assume that it will come
        // in the next argument.
        if (value.empty() && option->expectsValue()) {
            expectingVal = option;
            expectingValName = arg;
        }
        else {
            std::string result = option->set(arg, value, options.ignoreDuplicates);
            if (!result.empty())
                errors.emplace_back(fmt::format("{}: {}", programName, result));
        }
    }

    if (expectingVal) {
        errors.emplace_back(fmt::format("{}: no value provided for argument '{}'"sv, programName,
                                        expectingValName));
    }

    if (!positional && !firstPositional.empty() && !hadUnknowns) {
        errors.emplace_back(
            fmt::format("{}: positional arguments are not allowed (see e.g. '{}')"sv, programName,
                        firstPositional));
    }

    return errors.empty();
}